

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file1.cpp
# Opt level: O0

int foobar(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  char *in_R8;
  string_view delim;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  string local_c0;
  undefined1 local_a0 [8];
  CSVFileInfo info;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar1 = std::operator<<(poVar1,*(char **)file.field_2._8_8_);
    poVar1 = std::operator<<(poVar1," [file]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  __s = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  csv::get_file_info((CSVFileInfo *)local_a0,(string *)local_38);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_38);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Columns: ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,", ");
  delim._M_str = in_R8;
  delim._M_len = (size_t)local_d0._M_str;
  csv::internals::format_row
            (&local_c0,(internals *)(info.filename.field_2._M_local_buf + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d0._M_len,delim);
  poVar1 = std::operator<<(poVar1,(string *)&local_c0);
  poVar1 = std::operator<<(poVar1,"Dimensions: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info._56_8_);
  poVar1 = std::operator<<(poVar1," rows x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,info.n_rows);
  poVar1 = std::operator<<(poVar1," columns");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Delimiter: ");
  poVar1 = std::operator<<(poVar1,(char)info.col_names.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_c0);
  csv::CSVFileInfo::~CSVFileInfo((CSVFileInfo *)local_a0);
  std::__cxx11::string::~string((string *)local_38);
  return 0;
}

Assistant:

int foobar(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string file = argv[1];
    auto info = get_file_info(file);

    std::cout << file << std::endl
        << "Columns: " << internals::format_row(info.col_names, ", ")
        << "Dimensions: " << info.n_rows << " rows x " << info.n_cols << " columns" << std::endl
        << "Delimiter: " << info.delim << std::endl;

    return 0;
}